

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O0

string * to_string_abi_cxx11_(ze_image_type_t type)

{
  int in_ESI;
  undefined4 in_register_0000003c;
  string *this;
  __cxx11 local_48 [32];
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [16];
  allocator local_15 [5];
  string *psStack_10;
  ze_image_type_t type_local;
  
  this = (string *)CONCAT44(in_register_0000003c,type);
  psStack_10 = this;
  if (in_ESI == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_IMAGE_TYPE_1D",local_15);
    std::allocator<char>::~allocator((allocator<char> *)local_15);
  }
  else if (in_ESI == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_IMAGE_TYPE_2D",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
  }
  else if (in_ESI == 4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_IMAGE_TYPE_3D",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
  }
  else if (in_ESI == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_IMAGE_TYPE_1DARRAY",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
  }
  else if (in_ESI == 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_IMAGE_TYPE_2DARRAY",&local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_28);
  }
  else {
    std::__cxx11::to_string(local_48,in_ESI);
    std::operator+((char *)this,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Unknown ze_image_type_t value: ");
    std::__cxx11::string::~string((string *)local_48);
  }
  return this;
}

Assistant:

std::string to_string(const ze_image_type_t type) {
  if (type == ZE_IMAGE_TYPE_1D) {
    return "ZE_IMAGE_TYPE_1D";
  } else if (type == ZE_IMAGE_TYPE_2D) {
    return "ZE_IMAGE_TYPE_2D";
  } else if (type == ZE_IMAGE_TYPE_3D) {
    return "ZE_IMAGE_TYPE_3D";
  } else if (type == ZE_IMAGE_TYPE_1DARRAY) {
    return "ZE_IMAGE_TYPE_1DARRAY";
  } else if (type == ZE_IMAGE_TYPE_2DARRAY) {
    return "ZE_IMAGE_TYPE_2DARRAY";
  } else {
    return "Unknown ze_image_type_t value: " +
           std::to_string(static_cast<int>(type));
  }
}